

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.h
# Opt level: O0

int pbrt::PermutationElement(uint32_t i,uint32_t l,uint32_t p)

{
  uint uVar1;
  uint uVar2;
  uint32_t w;
  uint32_t p_local;
  uint32_t l_local;
  uint32_t i_local;
  
  uVar1 = l - 1 >> 1 | l - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  i_local = i;
  do {
    uVar2 = p >> 0x10 ^ (p ^ i_local) * -0x1e8f76c3;
    uVar2 = p >> 0x17 ^ (p >> 8 ^ (uVar2 & uVar1) >> 4 ^ uVar2) * 0x929eb3f;
    uVar2 = (p >> 0x1b | 1) * ((uVar2 & uVar1) >> 1 ^ uVar2) * 0x6935fa69;
    uVar2 = ((uVar2 & uVar1) >> 0xb ^ uVar2) * 0x74dcb303;
    uVar2 = ((uVar2 & uVar1) >> 2 ^ uVar2) * -0x61afe33d;
    uVar2 = uVar1 & ((uVar2 & uVar1) >> 2 ^ uVar2) * -0x379f5c21;
    i_local = uVar2 >> 5 ^ uVar2;
  } while (l <= i_local);
  return (i_local + p) % l;
}

Assistant:

PBRT_CPU_GPU
inline int PermutationElement(uint32_t i, uint32_t l, uint32_t p) {
    uint32_t w = l - 1;
    w |= w >> 1;
    w |= w >> 2;
    w |= w >> 4;
    w |= w >> 8;
    w |= w >> 16;
    do {
        i ^= p;
        i *= 0xe170893d;
        i ^= p >> 16;
        i ^= (i & w) >> 4;
        i ^= p >> 8;
        i *= 0x0929eb3f;
        i ^= p >> 23;
        i ^= (i & w) >> 1;
        i *= 1 | p >> 27;
        i *= 0x6935fa69;
        i ^= (i & w) >> 11;
        i *= 0x74dcb303;
        i ^= (i & w) >> 2;
        i *= 0x9e501cc3;
        i ^= (i & w) >> 2;
        i *= 0xc860a3df;
        i &= w;
        i ^= i >> 5;
    } while (i >= l);
    return (i + p) % l;
}